

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_34(QPDF *pdf,char *arg2)

{
  int iVar1;
  ostream *poVar2;
  void *pvVar3;
  undefined1 auVar4 [12];
  int local_ec;
  string local_e8 [4];
  int extension_level;
  string v_string;
  undefined8 local_b8;
  PDFVersion v;
  QPDFObjectHandle local_88;
  QPDFObjectHandle local_78;
  string local_68 [48];
  string local_38 [32];
  char *local_18;
  char *arg2_local;
  QPDF *pdf_local;
  
  local_18 = arg2;
  arg2_local = (char *)pdf;
  poVar2 = std::operator<<((ostream *)&std::cout,"version: ");
  QPDF::getPDFVersion_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"extension level: ");
  iVar1 = QPDF::getExtensionLevel();
  pvVar3 = (void *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  QPDF::getRoot();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&v.extension_level,"/Extensions",
             (allocator<char> *)((long)&v.minor_version + 3));
  QPDFObjectHandle::getKey((string *)&local_78);
  QPDFObjectHandle::unparse_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_68);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_68);
  QPDFObjectHandle::~QPDFObjectHandle(&local_78);
  std::__cxx11::string::~string((string *)&v.extension_level);
  std::allocator<char>::~allocator((allocator<char> *)((long)&v.minor_version + 3));
  QPDFObjectHandle::~QPDFObjectHandle(&local_88);
  std::__cxx11::string::~string(local_38);
  auVar4 = QPDF::getVersionAsPDFVersion();
  v.major_version = auVar4._8_4_;
  v_string.field_2._8_8_ = auVar4._0_8_;
  local_b8 = v_string.field_2._8_8_;
  std::__cxx11::string::string(local_e8);
  PDFVersion::getVersion((string *)&local_b8,(int *)local_e8);
  poVar2 = std::operator<<((ostream *)&std::cout,"As PDFVersion: ");
  poVar2 = std::operator<<(poVar2,local_e8);
  poVar2 = std::operator<<(poVar2,"/");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,local_ec);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_e8);
  return;
}

Assistant:

static void
test_34(QPDF& pdf, char const* arg2)
{
    // Look at Extensions dictionary
    std::cout << "version: " << pdf.getPDFVersion() << std::endl
              << "extension level: " << pdf.getExtensionLevel() << std::endl
              << pdf.getRoot().getKey("/Extensions").unparse() << std::endl;
    auto v = pdf.getVersionAsPDFVersion();
    std::string v_string;
    int extension_level;
    v.getVersion(v_string, extension_level);
    std::cout << "As PDFVersion: " << v_string << "/" << extension_level << std::endl;
}